

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void ConvexDecomposition::extrude(cbtHullTriangle *t0,int v)

{
  int iVar1;
  int c;
  int b;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  cbtHullTriangle *this;
  cbtHullTriangle **ppcVar6;
  int *piVar7;
  cbtHullTriangle *this_00;
  cbtHullTriangle *this_01;
  
  uVar4 = tris._8_4_;
  c = (t0->super_int3).x;
  b = (t0->super_int3).y;
  iVar2 = (t0->super_int3).z;
  this = (cbtHullTriangle *)::operator_new(0x24);
  cbtHullTriangle::cbtHullTriangle(this,v,b,iVar2);
  iVar3 = (t0->n).x;
  iVar5 = uVar4 + 1;
  iVar1 = uVar4 + 2;
  (this->n).x = iVar3;
  (this->n).y = iVar5;
  (this->n).z = iVar1;
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar3);
  piVar7 = cbtHullTriangle::neib(*ppcVar6,b,iVar2);
  *piVar7 = uVar4;
  this_00 = (cbtHullTriangle *)::operator_new(0x24);
  cbtHullTriangle::cbtHullTriangle(this_00,v,iVar2,c);
  iVar3 = (t0->n).y;
  (this_00->n).x = iVar3;
  (this_00->n).y = iVar1;
  (this_00->n).z = uVar4;
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar3);
  piVar7 = cbtHullTriangle::neib(*ppcVar6,iVar2,c);
  *piVar7 = iVar5;
  this_01 = (cbtHullTriangle *)::operator_new(0x24);
  cbtHullTriangle::cbtHullTriangle(this_01,v,c,b);
  iVar2 = (t0->n).z;
  (this_01->n).x = iVar2;
  (this_01->n).y = uVar4;
  (this_01->n).z = iVar5;
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar2);
  piVar7 = cbtHullTriangle::neib(*ppcVar6,c,b);
  *piVar7 = iVar1;
  checkit(this);
  checkit(this_00);
  checkit(this_01);
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this->n).x);
  iVar5 = hasvert(&(*ppcVar6)->super_int3,v);
  if (iVar5 != 0) {
    ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this->n).x);
    removeb2b(this,*ppcVar6);
  }
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this_00->n).x);
  iVar5 = hasvert(&(*ppcVar6)->super_int3,v);
  if (iVar5 != 0) {
    ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this_00->n).x);
    removeb2b(this_00,*ppcVar6);
  }
  ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this_01->n).x);
  iVar5 = hasvert(&(*ppcVar6)->super_int3,v);
  if (iVar5 != 0) {
    ppcVar6 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(this_01->n).x);
    removeb2b(this_01,*ppcVar6);
  }
  cbtHullTriangle::~cbtHullTriangle(t0);
  ::operator_delete(t0,0x24);
  return;
}

Assistant:

void extrude(cbtHullTriangle *t0,int v)
{
	int3 t= *t0;
	int n = tris.count;
	cbtHullTriangle* ta = new cbtHullTriangle(v,t[1],t[2]);
	ta->n = int3(t0->n[0],n+1,n+2);
	tris[t0->n[0]]->neib(t[1],t[2]) = n+0;
	cbtHullTriangle* tb = new cbtHullTriangle(v,t[2],t[0]);
	tb->n = int3(t0->n[1],n+2,n+0);
	tris[t0->n[1]]->neib(t[2],t[0]) = n+1;
	cbtHullTriangle* tc = new cbtHullTriangle(v,t[0],t[1]);
	tc->n = int3(t0->n[2],n+0,n+1);
	tris[t0->n[2]]->neib(t[0],t[1]) = n+2;
	checkit(ta);
	checkit(tb);
	checkit(tc);
	if(hasvert(*tris[ta->n[0]],v)) removeb2b(ta,tris[ta->n[0]]);
	if(hasvert(*tris[tb->n[0]],v)) removeb2b(tb,tris[tb->n[0]]);
	if(hasvert(*tris[tc->n[0]],v)) removeb2b(tc,tris[tc->n[0]]);
	delete t0;

}